

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O3

bool __thiscall tinyusdz::GPrim::set_primvar(GPrim *this,GeomPrimvar *primvar,string *err)

{
  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  undefined8 uVar4;
  size_type sVar5;
  int iVar6;
  mapped_type *pmVar7;
  Sample *sample;
  pointer pSVar8;
  pointer pSVar9;
  bool bVar10;
  string primvar_name;
  string index_name;
  Attribute indices;
  storage_union local_be0;
  undefined8 *local_bd0;
  undefined1 local_bc8;
  undefined1 local_bc0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba0;
  key_type local_b80;
  undefined1 local_b60 [40];
  _Alloc_hider local_b38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b28;
  storage_union local_b18;
  vtable_type *local_b08;
  bool local_b00;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  local_af8;
  bool local_ae0;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_ad8;
  AttrMetas local_ac0;
  Attribute local_8b8;
  Property local_610;
  
  paVar1 = &local_610._attrib._name.field_2;
  pcVar2 = (primvar->_name)._M_dataplus._M_p;
  local_610._attrib._name._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_610,pcVar2,pcVar2 + (primvar->_name)._M_string_length);
  sVar5 = local_610._attrib._name._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._attrib._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_610._attrib._name._M_dataplus._M_p,
                    local_610._attrib._name.field_2._M_allocated_capacity + 1);
  }
  if (sVar5 == 0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    return false;
  }
  pcVar2 = (primvar->_name)._M_dataplus._M_p;
  local_610._attrib._name._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_610,pcVar2,pcVar2 + (primvar->_name)._M_string_length);
  local_b60._0_8_ = local_b60 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b60,"primvars:","");
  uVar4 = local_b60._0_8_;
  if (local_610._attrib._name._M_string_length < (ulong)local_b60._8_8_) {
    bVar10 = false;
  }
  else if (local_b60._8_8_ == 0) {
    bVar10 = true;
  }
  else {
    iVar6 = bcmp((void *)local_b60._0_8_,local_610._attrib._name._M_dataplus._M_p,local_b60._8_8_);
    bVar10 = iVar6 == 0;
  }
  if ((undefined1 *)uVar4 != local_b60 + 0x10) {
    operator_delete((void *)uVar4,local_b60._16_8_ + 1);
  }
  paVar1 = &local_610._attrib._name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._attrib._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_610._attrib._name._M_dataplus._M_p,
                    local_610._attrib._name.field_2._M_allocated_capacity + 1);
  }
  if (bVar10) {
    if (err == (string *)0x0) {
      return false;
    }
    local_b60._0_8_ = local_b60 + 0x10;
    pcVar2 = (primvar->_name)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_b60,pcVar2,pcVar2 + (primvar->_name)._M_string_length);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_610
                     ,"GeomPrimvar.name must not start with `primvars:` namespace. name = ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b60)
    ;
    ::std::__cxx11::string::_M_append((char *)err,(ulong)local_610._attrib._name._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610._attrib._name._M_dataplus._M_p != paVar1) {
      operator_delete(local_610._attrib._name._M_dataplus._M_p,
                      local_610._attrib._name.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_b60._0_8_ == local_b60 + 0x10) {
      return false;
    }
    operator_delete((void *)local_b60._0_8_,local_b60._16_8_ + 1);
    return false;
  }
  pcVar2 = (primvar->_name)._M_dataplus._M_p;
  local_610._attrib._name._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_610,pcVar2,pcVar2 + (primvar->_name)._M_string_length);
  ::std::operator+(&local_ba0,"primvars:",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_610);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._attrib._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_610._attrib._name._M_dataplus._M_p,
                    local_610._attrib._name.field_2._M_allocated_capacity + 1);
  }
  local_b60._0_8_ = local_b60 + 0x10;
  pcVar3 = (primvar->_attr)._name._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_b60,pcVar3,pcVar3 + (primvar->_attr)._name._M_string_length);
  local_b60[0x24] = (primvar->_attr)._varying_authored;
  local_b60._32_4_ = (primvar->_attr)._variability;
  local_b38._M_p = (pointer)&local_b28;
  pcVar3 = (primvar->_attr)._type_name._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b38,pcVar3,pcVar3 + (primvar->_attr)._type_name._M_string_length);
  local_b08 = (primvar->_attr)._var._value.v_.vtable;
  if (local_b08 != (vtable_type *)0x0) {
    (*local_b08->copy)((storage_union *)&(primvar->_attr)._var,&local_b18);
  }
  local_b00 = (primvar->_attr)._var._blocked;
  std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::vector(&local_af8,&(primvar->_attr)._var._ts._samples);
  local_ae0 = (primvar->_attr)._var._ts._dirty;
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&local_ad8,&(primvar->_attr)._paths);
  AttrMetas::AttrMetas(&local_ac0,&(primvar->_attr)._metas);
  if (((primvar->_interpolation).has_value_ == true) &&
     (local_ac0.interpolation.contained = (primvar->_interpolation).contained,
     local_ac0.interpolation.has_value_ == false)) {
    local_ac0.interpolation.has_value_ = true;
  }
  if (((primvar->_elementSize).has_value_ == true) &&
     (local_ac0.elementSize.contained = (primvar->_elementSize).contained,
     local_ac0.elementSize.has_value_ == false)) {
    local_ac0.elementSize.has_value_ = true;
  }
  Property::Property(&local_610,(Attribute *)local_b60,false);
  pmVar7 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
           ::operator[](&this->props,(key_type *)&local_ba0);
  Property::operator=(pmVar7,&local_610);
  Property::~Property(&local_610);
  local_bd0 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_be0.dynamic = (void *)0x0;
  local_bc8 = 0;
  local_bc0._0_8_ = (pointer)0x0;
  local_bc0[8] = 0;
  local_bc0._9_7_ = 0;
  local_bc0[0x10] = 0;
  local_bc0._17_8_ = 0;
  if ((primvar->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (primvar->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    linb::any::operator=((any *)&local_be0,&primvar->_indices);
  }
  this_00 = &primvar->_ts_indices;
  if ((primvar->_ts_indices)._dirty == true) {
    TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::update(this_00);
  }
  pSVar8 = (primvar->_ts_indices)._samples.
           super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar9 = (primvar->_ts_indices)._samples.
           super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar9 != pSVar8) {
    if ((primvar->_ts_indices)._dirty == true) {
      TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::update(this_00);
      pSVar8 = (primvar->_ts_indices)._samples.
               super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar9 = (primvar->_ts_indices)._samples.
               super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (pSVar8 != pSVar9) {
      do {
        tinyusdz::primvar::PrimVar::set_timesample<std::vector<int,std::allocator<int>>>
                  ((PrimVar *)&local_be0,pSVar8->t,&pSVar8->value);
        pSVar8 = pSVar8 + 1;
      } while (pSVar8 != pSVar9);
    }
  }
  if ((primvar->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (primvar->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if ((primvar->_ts_indices)._dirty == true) {
      TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::update(this_00);
    }
    if ((primvar->_ts_indices)._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (primvar->_ts_indices)._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) goto LAB_0046e0a2;
  }
  local_8b8._name._M_dataplus._M_p = (pointer)&local_8b8._name.field_2;
  local_8b8._name._M_string_length = 0;
  local_8b8._name.field_2._M_local_buf[0] = '\0';
  local_8b8._variability = Varying;
  local_8b8._varying_authored = false;
  paVar1 = &local_8b8._type_name.field_2;
  local_8b8._type_name._M_string_length = 0;
  local_8b8._type_name.field_2._M_local_buf[0] = '\0';
  local_8b8._var._value.v_.vtable =
       (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_8b8._var._value.v_.storage.dynamic = (void *)0x0;
  local_8b8._var._blocked = false;
  local_8b8._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_8b8._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_8b8._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_8b8._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_8b8._var._ts._17_8_ = 0;
  local_8b8._metas.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
  local_8b8._metas.elementSize.has_value_ = false;
  local_8b8._metas.elementSize.contained = (storage_t<unsigned_int>)0x0;
  local_8b8._metas.hidden.has_value_ = false;
  local_8b8._metas.hidden.contained = (storage_t<bool>)0x0;
  local_8b8._metas.comment.has_value_ = false;
  local_8b8._metas.weight.contained = (storage_t<double>)0x0;
  local_8b8._metas.connectability.has_value_ = false;
  local_8b8._metas.bindMaterialAs.contained._16_8_ = 0;
  local_8b8._metas.bindMaterialAs.contained._24_8_ = 0;
  local_8b8._metas.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
  ;
  local_8b8._metas.bindMaterialAs.contained._8_8_ = 0;
  local_8b8._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_8b8._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header;
  local_8b8._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_8b8._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_8b8._metas.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_8b8._metas.comment.contained._8_8_ = 0;
  local_8b8._metas.comment.contained._16_8_ = 0;
  local_8b8._metas.comment.contained._24_8_ = 0;
  local_8b8._metas.comment.contained._32_8_ = 0;
  local_8b8._metas.comment.contained._40_8_ = 0;
  local_8b8._metas.customData.has_value_ = false;
  local_8b8._metas.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_8b8._metas.customData.contained._8_8_ = 0;
  local_8b8._metas.customData.contained._16_8_ = 0;
  local_8b8._metas.customData.contained._24_8_ = 0;
  local_8b8._metas.customData.contained._32_8_ = 0;
  local_8b8._metas.customData.contained._40_8_ = 0;
  local_8b8._metas.weight.has_value_ = false;
  local_8b8._metas.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
  ;
  local_8b8._metas.connectability.contained._8_8_ = 0;
  local_8b8._metas.connectability.contained._16_8_ = 0;
  local_8b8._metas.connectability.contained._24_8_ = 0;
  local_8b8._metas.outputName.has_value_ = false;
  local_8b8._metas.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_8b8._metas.outputName.contained._8_8_ = 0;
  local_8b8._metas.outputName.contained._16_8_ = 0;
  local_8b8._metas.outputName.contained._24_8_ = 0;
  local_8b8._metas.renderType.has_value_ = false;
  local_8b8._metas.sdrMetadata.has_value_ = false;
  local_8b8._metas.renderType.contained._16_8_ = 0;
  local_8b8._metas.renderType.contained._24_8_ = 0;
  local_8b8._metas.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_8b8._metas.renderType.contained._8_8_ = 0;
  local_8b8._metas.displayName.has_value_ = false;
  local_8b8._metas.sdrMetadata.contained._32_8_ = 0;
  local_8b8._metas.sdrMetadata.contained._40_8_ = 0;
  local_8b8._metas.sdrMetadata.contained._16_8_ = 0;
  local_8b8._metas.sdrMetadata.contained._24_8_ = 0;
  local_8b8._metas.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_8b8._metas.sdrMetadata.contained._8_8_ = 0;
  local_8b8._metas.displayGroup.has_value_ = false;
  local_8b8._metas.displayName.contained._16_8_ = 0;
  local_8b8._metas.displayName.contained._24_8_ = 0;
  local_8b8._metas.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_8b8._metas.displayName.contained._8_8_ = 0;
  local_8b8._metas.bindMaterialAs.has_value_ = false;
  local_8b8._metas.displayGroup.contained._16_8_ = 0;
  local_8b8._metas.displayGroup.contained._24_8_ = 0;
  local_8b8._metas.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_8b8._metas.displayGroup.contained._8_8_ = 0;
  local_8b8._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_8b8._153_8_ = 0;
  local_8b8._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_8b8._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_8b8._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  local_8b8._metas.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_8b8._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_8b8._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8b8._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8b8._type_name._M_dataplus._M_p = (pointer)paVar1;
  local_8b8._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_8b8._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Attribute::set_var(&local_8b8,(PrimVar *)&local_be0);
  local_b80._M_dataplus._M_p = (pointer)&local_b80.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b80,local_ba0._M_dataplus._M_p,
             local_ba0._M_dataplus._M_p + local_ba0._M_string_length);
  ::std::__cxx11::string::append((char *)&local_b80);
  Property::Property(&local_610,&local_8b8,false);
  pmVar7 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
           ::operator[](&this->props,&local_b80);
  Property::operator=(pmVar7,&local_610);
  Property::~Property(&local_610);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
    operator_delete(local_b80._M_dataplus._M_p,local_b80.field_2._M_allocated_capacity + 1);
  }
  AttrMetas::~AttrMetas(&local_8b8._metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_8b8._paths);
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)&local_8b8._var._ts);
  if (local_8b8._var._value.v_.vtable != (vtable_type *)0x0) {
    (*(local_8b8._var._value.v_.vtable)->destroy)((storage_union *)&local_8b8._var);
    local_8b8._var._value.v_.vtable = (vtable_type *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b8._type_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_8b8._type_name._M_dataplus._M_p,
                    CONCAT71(local_8b8._type_name.field_2._M_allocated_capacity._1_7_,
                             local_8b8._type_name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b8._name._M_dataplus._M_p != &local_8b8._name.field_2) {
    operator_delete(local_8b8._name._M_dataplus._M_p,
                    CONCAT71(local_8b8._name.field_2._M_allocated_capacity._1_7_,
                             local_8b8._name.field_2._M_local_buf[0]) + 1);
  }
LAB_0046e0a2:
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)local_bc0);
  if (local_bd0 != (undefined8 *)0x0) {
    (*(code *)local_bd0[4])(&local_be0);
  }
  AttrMetas::~AttrMetas(&local_ac0);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_ad8);
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)&local_af8);
  if (local_b08 != (vtable_type *)0x0) {
    (*local_b08->destroy)(&local_b18);
    local_b08 = (vtable_type *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b38._M_p != &local_b28) {
    operator_delete(local_b38._M_p,local_b28._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_b60._0_8_ != local_b60 + 0x10) {
    operator_delete((void *)local_b60._0_8_,local_b60._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba0._M_dataplus._M_p != &local_ba0.field_2) {
    operator_delete(local_ba0._M_dataplus._M_p,local_ba0.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool GPrim::set_primvar(const GeomPrimvar &primvar,
                        std::string *err) {
  if (primvar.name().empty()) {
    if (err) {
      (*err) += "GeomPrimvar.name is empty.";
    }
    return false;
  }

  if (startsWith(primvar.name(), "primvars:")) {
    if (err) {
      (*err) += "GeomPrimvar.name must not start with `primvars:` namespace. name = " + primvar.name();
    }
    return false;
  }

  std::string primvar_name = kPrimvars + primvar.name();

  // Overwrite existing primvar prop.
  // TODO: Report warn when primvar name already exists.

  Attribute attr = primvar.get_attribute();

  if (primvar.has_interpolation()) {
    attr.metas().interpolation = primvar.get_interpolation();
  }

  if (primvar.has_elementSize()) {
    attr.metas().elementSize = primvar.get_elementSize();
  }

  props[primvar_name] = attr;

  {
    primvar::PrimVar var;

    if (primvar.has_default_indices()) {
      var.set_value(primvar.get_default_indices());
    }

    if (primvar.has_timesampled_indices()) {
      for (const auto &sample : primvar.get_timesampled_indices().get_samples()) {
        var.set_timesample(sample.t, sample.value);
      }
    }

    if (primvar.has_default_indices() || primvar.has_timesampled_indices()) {
      Attribute indices;
      indices.set_var(var);
      std::string index_name = primvar_name + kIndices;
      props[index_name] = indices;
    }

  }

  return true;
}